

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O3

void __thiscall wabt::Token::Destroy(Token *this)

{
  pointer pcVar1;
  
  if (this->token_type_ - First_Literal < 3) {
    pcVar1 = (pointer)(this->field_2).text_._M_string_length;
    if (pcVar1 == (pointer)((long)&this->field_2 + 0x18U)) goto LAB_00f51464;
  }
  else {
    pcVar1 = (this->field_2).text_._M_dataplus._M_p;
    if (pcVar1 == (pointer)((long)&this->field_2 + 0x10) ||
        this->token_type_ - First_Type < 0xfffffffb) goto LAB_00f51464;
  }
  operator_delete(pcVar1);
LAB_00f51464:
  this->token_type_ = First;
  return;
}

Assistant:

void Token::Destroy() {
  if (HasLiteral()) {
    Destruct(literal_);
  } else if (HasOpcode()) {
    Destruct(opcode_);
  } else if (HasText()) {
    Destruct(text_);
  } else if (HasType()) {
    Destruct(type_);
  }
  token_type_ = TokenType::Invalid;
}